

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O1

void Abc_SclPerformBuffering_rec(Abc_Obj_t *pObj,int DegreeR,int Degree,int fUseInvs,int fVerbose)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  uint uVar4;
  Abc_Obj_t *pFaninNew;
  Vec_Ptr_t *vNodes;
  void **ppvVar5;
  int iVar6;
  uint uVar7;
  int Fill;
  long lVar8;
  long lVar9;
  ulong uVar10;
  
  pAVar2 = pObj->pNtk;
  iVar1 = pObj->Id;
  Vec_IntFillExtra(&pAVar2->vTravIds,iVar1 + 1,Degree);
  if (((long)iVar1 < 0) || ((pAVar2->vTravIds).nSize <= iVar1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar3 = pObj->pNtk;
  iVar6 = pAVar3->nTravIds;
  if ((pAVar2->vTravIds).pArray[iVar1] != iVar6) {
    iVar1 = pObj->Id;
    Vec_IntFillExtra(&pAVar3->vTravIds,iVar1 + 1,Fill);
    if (((long)iVar1 < 0) || ((pAVar3->vTravIds).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar3->vTravIds).pArray[iVar1] = iVar6;
    uVar4 = *(uint *)&pObj->field_0x14;
    *(uint *)&pObj->field_0x14 = uVar4 & 0xfff;
    uVar4 = uVar4 & 0xf;
    if (uVar4 - 5 < 0xfffffffe) {
      if ((7 < uVar4) || ((0xa4U >> uVar4 & 1) == 0)) {
        __assert_fail("Abc_ObjIsCi(pObj) || Abc_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclBuffer.c"
                      ,0x1af,"void Abc_SclPerformBuffering_rec(Abc_Obj_t *, int, int, int, int)");
      }
      uVar4 = (pObj->vFanouts).nSize;
      uVar10 = (ulong)uVar4;
      if (0 < (int)uVar4) {
        lVar8 = 0;
        do {
          Abc_SclPerformBuffering_rec
                    ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar8]],DegreeR,
                     Degree,fUseInvs,fVerbose);
          lVar8 = lVar8 + 1;
          uVar10 = (ulong)(pObj->vFanouts).nSize;
        } while (lVar8 < (long)uVar10);
      }
      while (Degree < (pObj->vFanouts).nSize) {
        Abc_SclPerformBufferingOne(pObj,Degree,fUseInvs,fVerbose);
      }
      if (DegreeR < (int)uVar10 && DegreeR != 0) {
        if (fUseInvs == 0) {
          pFaninNew = Abc_NtkCreateNodeBuf(pObj->pNtk,(Abc_Obj_t *)0x0);
        }
        else {
          pFaninNew = Abc_NtkCreateNodeInv(pObj->pNtk,(Abc_Obj_t *)0x0);
        }
        iVar1 = (pObj->vFanouts).nSize;
        vNodes = (Vec_Ptr_t *)malloc(0x10);
        iVar6 = 8;
        if (6 < iVar1 - 1U) {
          iVar6 = iVar1;
        }
        vNodes->nSize = 0;
        vNodes->nCap = iVar6;
        if (iVar6 == 0) {
          ppvVar5 = (void **)0x0;
        }
        else {
          ppvVar5 = (void **)malloc((long)iVar6 << 3);
        }
        vNodes->pArray = ppvVar5;
        Abc_NodeCollectFanouts(pObj,vNodes);
        if (0 < vNodes->nSize) {
          lVar8 = 0;
          do {
            Abc_ObjPatchFanin((Abc_Obj_t *)vNodes->pArray[lVar8],pObj,pFaninNew);
            lVar8 = lVar8 + 1;
          } while (lVar8 < vNodes->nSize);
        }
        if (vNodes->pArray != (void **)0x0) {
          free(vNodes->pArray);
          vNodes->pArray = (void **)0x0;
        }
        free(vNodes);
        Abc_ObjAddFanin(pFaninNew,pObj);
        lVar8 = (long)(pFaninNew->vFanouts).nSize;
        if (lVar8 < 1) {
          uVar4 = 0x1000;
        }
        else {
          lVar9 = 0;
          uVar4 = 0;
          do {
            uVar7 = *(uint *)((long)pFaninNew->pNtk->vObjs->pArray
                                    [(pFaninNew->vFanouts).pArray[lVar9]] + 0x14) >> 0xc;
            if (uVar7 < uVar4) {
              uVar7 = uVar4;
            }
            uVar4 = uVar7;
            lVar9 = lVar9 + 1;
          } while (lVar8 != lVar9);
          uVar4 = uVar4 * 0x1000 + 0x1000;
        }
        *(uint *)&pFaninNew->field_0x14 = *(uint *)&pFaninNew->field_0x14 & 0xfff | uVar4;
        if (fUseInvs != 0) {
          Abc_NodeInvUpdateFanPolarity(pFaninNew);
        }
      }
      lVar8 = (long)(pObj->vFanouts).nSize;
      if (lVar8 < 1) {
        uVar4 = 0x1000;
      }
      else {
        lVar9 = 0;
        uVar4 = 0;
        do {
          uVar7 = *(uint *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar9]] + 0x14)
                  >> 0xc;
          if (uVar7 < uVar4) {
            uVar7 = uVar4;
          }
          uVar4 = uVar7;
          lVar9 = lVar9 + 1;
        } while (lVar8 != lVar9);
        uVar4 = uVar4 * 0x1000 + 0x1000;
      }
      *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xfff | uVar4;
    }
  }
  return;
}

Assistant:

void Abc_SclPerformBuffering_rec( Abc_Obj_t * pObj, int DegreeR, int Degree, int fUseInvs, int fVerbose )
{
    Vec_Ptr_t * vFanouts;
    Abc_Obj_t * pBuffer;
    Abc_Obj_t * pFanout;
    int i, nOldFanNum;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    pObj->Level = 0;
    if ( Abc_ObjIsCo(pObj) )
        return;
    assert( Abc_ObjIsCi(pObj) || Abc_ObjIsNode(pObj) );
    // buffer fanouts and collect reverse levels
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Abc_SclPerformBuffering_rec( pFanout, DegreeR, Degree, fUseInvs, fVerbose );
    // perform buffering as long as needed
    nOldFanNum = Abc_ObjFanoutNum(pObj);
    while ( Abc_ObjFanoutNum(pObj) > Degree )
        Abc_SclPerformBufferingOne( pObj, Degree, fUseInvs, fVerbose );
    // add yet another level of buffers
    if ( DegreeR && nOldFanNum > DegreeR )
    {
        if ( fUseInvs )
            pBuffer = Abc_NtkCreateNodeInv( pObj->pNtk, NULL );
        else
            pBuffer = Abc_NtkCreateNodeBuf( pObj->pNtk, NULL );
        vFanouts = Vec_PtrAlloc( Abc_ObjFanoutNum(pObj) );
        Abc_NodeCollectFanouts( pObj, vFanouts );
        Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, i )
            Abc_ObjPatchFanin( pFanout, pObj, pBuffer );
        Vec_PtrFree( vFanouts );
        Abc_ObjAddFanin( pBuffer, pObj );
        pBuffer->Level = Abc_SclComputeReverseLevel( pBuffer );
        if ( fUseInvs )
            Abc_NodeInvUpdateFanPolarity( pBuffer );
    }
    // compute the new level of the node
    pObj->Level = Abc_SclComputeReverseLevel( pObj );
}